

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O3

void XPMP2::XPMPSendNotification(Aircraft *plane,XPMPPlaneNotification _notification)

{
  undefined8 *puVar1;
  
  puVar1 = DAT_002ec4b0;
  if ((undefined8 **)DAT_002ec4b0 != &DAT_002ec4b0) {
    do {
      (*(code *)puVar1[2])(plane->modeS_id,_notification,puVar1[3]);
      puVar1 = (undefined8 *)*puVar1;
    } while ((undefined8 **)puVar1 != &DAT_002ec4b0);
  }
  return;
}

Assistant:

void XPMPSendNotification (const Aircraft& plane, XPMPPlaneNotification _notification)
{
    for (const XPMPPlaneNotifierTy& n: glob.listObservers)
        n.func(plane.GetModeS_ID(),
               _notification,
               n.refcon);
}